

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

char * c_escape(char *str,curl_off_t len)

{
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  size_t sVar4;
  byte *pbVar5;
  byte *local_60;
  dynbuf escaped;
  
  curlx_dyn_init(&escaped,0x1f43);
  if (len == -1) {
    len = strlen(str);
  }
  sVar4 = 2000;
  if (len < 2000) {
    sVar4 = len;
  }
  CVar2 = curlx_dyn_addn(&escaped,"",0);
  pbVar5 = (byte *)(str + 1);
  local_60 = (byte *)str;
  while( true ) {
    if ((CVar2 != CURLE_OK) || (sVar4 == 0)) break;
    bVar1 = pbVar5[-1];
    pcVar3 = (char *)memchr("\t\r\n?\"\\",(int)(char)bVar1,7);
    if (((pcVar3 != (char *)0x0) ||
        (CVar2 = CURLE_OK, (byte)(bVar1 + 0x81) < 0xa1 && (byte)(bVar1 - 0xe) < 0xfb)) &&
       (CVar2 = curlx_dyn_addn(&escaped,local_60,(long)str - (long)local_60), local_60 = pbVar5,
       CVar2 == CURLE_OK)) {
      if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
        pcVar3 = "\\x%02x";
        if (1 < (long)sVar4) {
          bVar1 = *pbVar5;
          pcVar3 = "\\%03o";
          if (((5 < (byte)(bVar1 + 0x9f) && 9 < (byte)(bVar1 - 0x30)) &&
              (pcVar3 = "\\x%02x", '@' < (char)bVar1)) && (pcVar3 = "\\x%02x", bVar1 < 0x47)) {
            pcVar3 = "\\%03o";
          }
        }
        CVar2 = curlx_dyn_addf(&escaped,pcVar3,(ulong)pbVar5[-1]);
      }
      else {
        CVar2 = curlx_dyn_addn(&escaped,"\\t\\r\\n\\?\\\"\\\\" + (long)(pcVar3 + -0x128dc4) * 2,2);
      }
    }
    str = str + 1;
    pbVar5 = pbVar5 + 1;
    sVar4 = sVar4 - 1;
  }
  if ((CVar2 == CURLE_OK) &&
     (CVar2 = curlx_dyn_addn(&escaped,local_60,(long)str - (long)local_60), CVar2 == CURLE_OK)) {
    curlx_dyn_addn(&escaped,"...",(ulong)(2000 < len) * 3);
  }
  pcVar3 = curlx_dyn_ptr(&escaped);
  return pcVar3;
}

Assistant:

static char *c_escape(const char *str, curl_off_t len)
{
  const char *s;
  unsigned int cutoff = 0;
  CURLcode result;
  struct curlx_dynbuf escaped;

  curlx_dyn_init(&escaped, 4 * MAX_STRING_LENGTH_OUTPUT + 3);

  if(len == ZERO_TERMINATED)
    len = strlen(str);

  if(len > MAX_STRING_LENGTH_OUTPUT) {
    /* cap ridiculously long strings */
    len = MAX_STRING_LENGTH_OUTPUT;
    cutoff = 3;
  }

  result = curlx_dyn_addn(&escaped, STRCONST(""));
  for(s = str; !result && len; s++, len--) {
    /* escape question marks as well, to prevent generating accidental
       trigraphs */
    static const char from[] = "\t\r\n?\"\\";
    static const char to[] = "\\t\\r\\n\\?\\\"\\\\";
    const char *p = strchr(from, *s);

    if(!p && ISPRINT(*s))
      continue;

    result = curlx_dyn_addn(&escaped, str, s - str);
    str = s + 1;

    if(!result) {
      if(p && *p)
        result = curlx_dyn_addn(&escaped, to + 2 * (p - from), 2);
      else {
        result = curlx_dyn_addf(&escaped,
                                /* Octal escape to avoid >2 digit hex. */
                                (len > 1 && ISXDIGIT(s[1])) ?
                                  "\\%03o" : "\\x%02x",
                                (unsigned int) *(const unsigned char *) s);
      }
    }
  }

  if(!result)
    result = curlx_dyn_addn(&escaped, str, s - str);

  if(!result)
    (void) !curlx_dyn_addn(&escaped, "...", cutoff);

  return curlx_dyn_ptr(&escaped);
}